

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void cmAddLinkDirectoryForTarget(void *arg,char *tgt,char *d)

{
  cmMakefile *pcVar1;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  void *local_28;
  cmMakefile *mf;
  char *d_local;
  char *tgt_local;
  void *arg_local;
  
  local_28 = arg;
  mf = (cmMakefile *)d;
  d_local = tgt;
  tgt_local = (char *)arg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,tgt,&local_49);
  pcVar1 = mf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,(char *)pcVar1,&local_81);
  cmMakefile::AddLinkDirectoryForTarget((cmMakefile *)arg,&local_48,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return;
}

Assistant:

void CCONV cmAddLinkDirectoryForTarget(void *arg, const char *tgt,
  const char* d)
{
  cmMakefile *mf = static_cast<cmMakefile *>(arg);
  mf->AddLinkDirectoryForTarget(tgt,d);
}